

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadBarcode.cpp
# Opt level: O1

ImageView *
ZXing::SetupLumImageView
          (ImageView *__return_storage_ptr__,ImageView iv,LumImage *lum,ReaderOptions *opts)

{
  uchar *puVar1;
  int iVar2;
  undefined4 uVar3;
  ImageFormat IVar4;
  int iVar5;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uVar6;
  int iVar7;
  invalid_argument *this;
  uint8_t *puVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  Image local_58;
  
  IVar4 = iv._format;
  iVar7 = iv._height;
  uVar12 = (ulong)iv._format;
  if (uVar12 == 0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid image format");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((opts->field_0x2 & 2) == 0) {
    if ((int)iv._format < 0x3020100) {
      if (iv._format != Lum) {
        if (iv._format != RGB) goto LAB_00136032;
        if (iv._pixStride == 3) {
          Image::Image(&local_58,iv._width,iv._height,Lum);
          if (0 < iVar7) {
            iVar7 = 0;
            puVar8 = local_58.super_ImageView._data;
            do {
              if (0 < iv._width) {
                lVar9 = 0;
                do {
                  lVar10 = (long)iv._rowStride * (long)iVar7;
                  lVar11 = (long)(int)lVar9 * (long)iv._pixStride;
                  puVar8[lVar9] =
                       (uint8_t)((uint)iv._data[lVar11 + 2 + lVar10] * 0x75 +
                                 (uint)iv._data[lVar11 + 1 + lVar10] * 0x259 +
                                 (uint)iv._data[lVar11 + lVar10] * 0x132 + 0x200 >> 10);
                  lVar9 = lVar9 + 1;
                } while (iv._width != (int)lVar9);
                puVar8 = puVar8 + lVar9;
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < iv._height);
          }
          goto LAB_001360e1;
        }
        if (uVar12 != 0x1000000) goto LAB_00135e3f;
      }
LAB_00135fc0:
      if (iv._pixStride != 1) {
        Image::Image(&local_58,iv._width,iv._height,Lum);
        if (0 < iVar7) {
          iVar7 = 0;
          puVar8 = local_58.super_ImageView._data;
          do {
            if (0 < iv._width) {
              lVar9 = 0;
              do {
                puVar8[lVar9] =
                     iv._data[(long)(int)lVar9 * (long)iv._pixStride +
                              (long)iv._rowStride * (long)iVar7];
                lVar9 = lVar9 + 1;
              } while (iv._width != (int)lVar9);
              puVar8 = puVar8 + lVar9;
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 < iv._height);
        }
        goto LAB_001360e1;
      }
    }
    else {
LAB_00135e3f:
      if (iv._format == BGR) {
        if (iv._pixStride == 3) {
          Image::Image(&local_58,iv._width,iv._height,Lum);
          if (0 < iVar7) {
            iVar7 = 0;
            puVar8 = local_58.super_ImageView._data;
            do {
              if (0 < iv._width) {
                lVar9 = 0;
                do {
                  lVar10 = (long)iv._rowStride * (long)iVar7;
                  lVar11 = (long)(int)lVar9 * (long)iv._pixStride;
                  puVar8[lVar9] =
                       (uint8_t)((uint)iv._data[lVar11 + lVar10] * 0x75 +
                                 (uint)iv._data[lVar11 + 1 + lVar10] * 0x259 +
                                 (uint)iv._data[lVar11 + 2 + lVar10] * 0x132 + 0x200 >> 10);
                  lVar9 = lVar9 + 1;
                } while (iv._width != (int)lVar9);
                puVar8 = puVar8 + lVar9;
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < iv._height);
          }
          goto LAB_001360e1;
        }
      }
      else if (iv._format == RGBA) {
        if (iv._pixStride == 4) {
          Image::Image(&local_58,iv._width,iv._height,Lum);
          if (0 < iVar7) {
            iVar7 = 0;
            puVar8 = local_58.super_ImageView._data;
            do {
              if (0 < iv._width) {
                lVar9 = 0;
                do {
                  lVar10 = (long)iv._rowStride * (long)iVar7;
                  lVar11 = (long)(int)lVar9 * (long)iv._pixStride;
                  puVar8[lVar9] =
                       (uint8_t)((uint)iv._data[lVar11 + 2 + lVar10] * 0x75 +
                                 (uint)iv._data[lVar11 + 1 + lVar10] * 0x259 +
                                 (uint)iv._data[lVar11 + lVar10] * 0x132 + 0x200 >> 10);
                  lVar9 = lVar9 + 1;
                } while (iv._width != (int)lVar9);
                puVar8 = puVar8 + lVar9;
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < iv._height);
          }
          goto LAB_001360e1;
        }
        if (uVar12 == 0x1000000) goto LAB_00135fc0;
      }
LAB_00136032:
      Image::Image(&local_58,iv._width,iv._height,Lum);
      if (0 < iVar7) {
        iVar7 = 0;
        puVar8 = local_58.super_ImageView._data;
        do {
          if (0 < iv._width) {
            lVar9 = 0;
            do {
              lVar10 = (long)(int)lVar9 * (long)iv._pixStride + (long)iv._rowStride * (long)iVar7;
              puVar8[lVar9] =
                   (uint8_t)((uint)iv._data[(uVar12 & 0xff) + lVar10] * 0x75 +
                             (uint)iv._data[(ulong)(IVar4 >> 8 & 0xff) + lVar10] * 0x259 +
                             (uint)iv._data[(ulong)(IVar4 >> 0x10 & 0xff) + lVar10] * 0x132 + 0x200
                            >> 10);
              lVar9 = lVar9 + 1;
            } while (iv._width != (int)lVar9);
            puVar8 = puVar8 + lVar9;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < iv._height);
      }
LAB_001360e1:
      uVar6._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           local_58._memory._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      (lum->super_Image).super_ImageView._width = local_58.super_ImageView._width;
      (lum->super_Image).super_ImageView._height = local_58.super_ImageView._height;
      (lum->super_Image).super_ImageView._pixStride = local_58.super_ImageView._pixStride;
      (lum->super_Image).super_ImageView._rowStride = local_58.super_ImageView._rowStride;
      (lum->super_Image).super_ImageView._data = local_58.super_ImageView._data;
      (lum->super_Image).super_ImageView._format = local_58.super_ImageView._format;
      (lum->super_Image).super_ImageView._width = local_58.super_ImageView._width;
      local_58._memory._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
      puVar1 = (lum->super_Image)._memory._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      (lum->super_Image)._memory._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (uchar *)uVar6._M_t.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      if (puVar1 != (uchar *)0x0) {
        operator_delete__(puVar1);
      }
      if ((_Head_base<0UL,_unsigned_char_*,_false>)
          local_58._memory._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
        operator_delete__((void *)local_58._memory._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      }
    }
    if ((lum->super_Image).super_ImageView._data != (uint8_t *)0x0) goto LAB_0013612b;
  }
  lum = (LumImage *)&iv;
LAB_0013612b:
  puVar8 = ((ImageView *)lum)->_data;
  IVar4 = ((ImageView *)lum)->_format;
  iVar5 = ((ImageView *)lum)->_width;
  iVar7 = ((ImageView *)lum)->_pixStride;
  iVar2 = ((ImageView *)lum)->_rowStride;
  uVar3 = *(undefined4 *)&((ImageView *)lum)->field_0x1c;
  __return_storage_ptr__->_height = ((ImageView *)lum)->_height;
  __return_storage_ptr__->_pixStride = iVar7;
  __return_storage_ptr__->_rowStride = iVar2;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar3;
  __return_storage_ptr__->_data = puVar8;
  __return_storage_ptr__->_format = IVar4;
  __return_storage_ptr__->_width = iVar5;
  return __return_storage_ptr__;
}

Assistant:

ImageView SetupLumImageView(ImageView iv, LumImage& lum, const ReaderOptions& opts)
{
	if (iv.format() == ImageFormat::None)
		throw std::invalid_argument("Invalid image format");

	if (opts.binarizer() == Binarizer::GlobalHistogram || opts.binarizer() == Binarizer::LocalAverage) {
		// manually spell out the 3 most common pixel formats to get at least gcc to vectorize the code
		if (iv.format() == ImageFormat::RGB && iv.pixStride() == 3) {
			lum = ExtractLum(iv, [](const uint8_t* src) { return RGBToLum(src[0], src[1], src[2]); });
		} else if (iv.format() == ImageFormat::RGBA && iv.pixStride() == 4) {
			lum = ExtractLum(iv, [](const uint8_t* src) { return RGBToLum(src[0], src[1], src[2]); });
		} else if (iv.format() == ImageFormat::BGR && iv.pixStride() == 3) {
			lum = ExtractLum(iv, [](const uint8_t* src) { return RGBToLum(src[2], src[1], src[0]); });
		} else if (iv.format() != ImageFormat::Lum) {
			lum = ExtractLum(iv, [r = RedIndex(iv.format()), g = GreenIndex(iv.format()), b = BlueIndex(iv.format())](
									 const uint8_t* src) { return RGBToLum(src[r], src[g], src[b]); });
		} else if (iv.pixStride() != 1) {
			// GlobalHistogram and LocalAverage need dense line memory layout
			lum = ExtractLum(iv, [](const uint8_t* src) { return *src; });
		}
		if (lum.data())
			return lum;
	}
	return iv;
}